

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

wchar_t parse__escape(wchar_t **ptr)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  long lVar4;
  wchar_t *pwVar5;
  int iVar6;
  wchar_t wVar7;
  wchar_t hex [17];
  wchar_t awStack_78 [16];
  undefined4 local_38;
  
  pwVar3 = *ptr;
  wVar1 = pwVar3[1];
  if (wVar1 == L'\0') {
    return L'\xffffffff';
  }
  pwVar2 = pwVar3 + 1;
  wVar7 = *pwVar3;
  pwVar5 = pwVar2;
  if (wVar7 == L'^') {
    wVar7 = L'\x7f';
    if (wVar1 != L'?') {
      wVar7 = wVar1 & 0x9f;
    }
  }
  else {
    pwVar5 = pwVar3;
    if (wVar7 == L'\\') {
      wVar7 = wVar1;
      if (wVar1 < L'a') {
        if ((uint)(wVar1 + L'\xffffffd0') < 8) {
          pwVar2 = pwVar3 + 4;
          wVar7 = L'\0';
          lVar4 = 4;
          do {
            if (*(int *)((long)pwVar3 + lVar4) - 0x38U < 0xfffffff8) {
              pwVar2 = (wchar_t *)((long)pwVar3 + lVar4);
              break;
            }
            wVar7 = *(int *)((long)pwVar3 + lVar4) + wVar7 * 8 + L'\xffffffd0';
            lVar4 = lVar4 + 4;
          } while ((int)lVar4 != 0x10);
          if (0xff < (uint)wVar7) {
            return L'\xffffffff';
          }
          pwVar5 = pwVar2 + -1;
        }
        else {
          pwVar5 = pwVar2;
          if (wVar1 == L'U') {
            pwVar2 = L"0123456789ABCDEF";
            pwVar5 = awStack_78;
            for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
              *(undefined8 *)pwVar5 = *(undefined8 *)pwVar2;
              pwVar2 = pwVar2 + 2;
              pwVar5 = (wchar_t *)((long)pwVar5 + 8);
            }
            local_38 = 0;
            if (pwVar3[2] != L'+') {
              return L'\xffffffff';
            }
            pwVar5 = pwVar3 + 3;
            wVar7 = L'\0';
            iVar6 = 5;
            do {
              pwVar3 = wcschr(awStack_78,*pwVar5);
              if ((iVar6 != 1) && (pwVar3 == (wchar_t *)0x0)) {
                return L'\xffffffff';
              }
              if (pwVar3 != (wchar_t *)0x0) {
                wVar7 = (uint)((ulong)((long)pwVar3 - (long)awStack_78) >> 2) | wVar7 << 4;
              }
              pwVar5 = pwVar5 + (pwVar3 != (wchar_t *)0x0);
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
            if (0x10ffff < (uint)wVar7) {
              return L'\xffffffff';
            }
          }
        }
      }
      else {
        pwVar5 = pwVar2;
        switch(wVar1) {
        case L'a':
          wVar7 = L'\a';
          break;
        case L'b':
          wVar7 = L'\b';
          break;
        case L'c':
        case L'd':
          break;
        case L'e':
          wVar7 = L'\x1b';
          break;
        case L'f':
          wVar7 = L'\f';
          break;
        default:
          switch(wVar1) {
          case L'n':
            wVar7 = L'\n';
            break;
          case L'r':
            wVar7 = L'\r';
            break;
          case L't':
            wVar7 = L'\t';
            break;
          case L'v':
            wVar7 = L'\v';
          }
        }
      }
    }
  }
  *ptr = pwVar5 + 1;
  return wVar7;
}

Assistant:

libedit_private int
parse__escape(const wchar_t **ptr)
{
	const wchar_t *p;
	wint_t c;

	p = *ptr;

	if (p[1] == 0)
		return -1;

	if (*p == '\\') {
		p++;
		switch (*p) {
		case 'a':
			c = '\007';	/* Bell */
			break;
		case 'b':
			c = '\010';	/* Backspace */
			break;
		case 't':
			c = '\011';	/* Horizontal Tab */
			break;
		case 'n':
			c = '\012';	/* New Line */
			break;
		case 'v':
			c = '\013';	/* Vertical Tab */
			break;
		case 'f':
			c = '\014';	/* Form Feed */
			break;
		case 'r':
			c = '\015';	/* Carriage Return */
			break;
		case 'e':
			c = '\033';	/* Escape */
			break;
		case 'U':		/* Unicode \U+xxxx or \U+xxxxx format */
		{
			int i;
			const wchar_t hex[] = L"0123456789ABCDEF";
			const wchar_t *h;
			++p;
			if (*p++ != '+')
				return -1;
			c = 0;
			for (i = 0; i < 5; ++i) {
				h = wcschr(hex, *p++);
				if (!h && i < 4)
					return -1;
				else if (h)
					c = (c << 4) | ((int)(h - hex));
				else
					--p;
			}
			if (c > 0x10FFFF) /* outside valid character range */
				return -1;
			break;
		}
		case '0':
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		{
			int cnt, ch;

			for (cnt = 0, c = 0; cnt < 3; cnt++) {
				ch = *p++;
				if (ch < '0' || ch > '7') {
					p--;
					break;
				}
				c = (c << 3) | (ch - '0');
			}
			if ((c & (wint_t)0xffffff00) != (wint_t)0)
				return -1;
			--p;
			break;
		}
		default:
			c = *p;
			break;
		}
	} else if (*p == '^') {
		p++;
		c = (*p == '?') ? '\177' : (*p & 0237);
	} else
		c = *p;
	*ptr = ++p;
	return c;
}